

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O1

void Sfm_TimGateArrival(Sfm_Tim_t *p,Mio_Gate_t *pGate,int **pTimesIn,int *pTimeOut)

{
  int *piVar1;
  Mio_PinPhase_t MVar2;
  Mio_Pin_t *pPin;
  int iVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  *pTimesIn = (int *)0x0;
  pPin = Mio_GateReadPins((Mio_Gate_t *)p);
  if (pPin == (Mio_Pin_t *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = 0;
    do {
      piVar1 = (int *)(&pGate->pName)[lVar4];
      MVar2 = Mio_PinReadPhase(pPin);
      dVar5 = Mio_PinReadDelayBlockRise(pPin);
      dVar6 = Mio_PinReadDelayBlockFall(pPin);
      if (MVar2 == MIO_PHASE_INV) {
LAB_00533d93:
        iVar3 = (int)((float)dVar5 * 1000.0) + piVar1[1];
        if (iVar3 < *(int *)pTimesIn) {
          iVar3 = *(int *)pTimesIn;
        }
        *(int *)pTimesIn = iVar3;
        iVar3 = (int)((float)dVar6 * 1000.0) + *piVar1;
        if (iVar3 < *(int *)((long)pTimesIn + 4)) {
          iVar3 = *(int *)((long)pTimesIn + 4);
        }
        *(int *)((long)pTimesIn + 4) = iVar3;
      }
      else {
        iVar3 = *piVar1 + (int)((float)dVar5 * 1000.0);
        if (iVar3 < *(int *)pTimesIn) {
          iVar3 = *(int *)pTimesIn;
        }
        *(int *)pTimesIn = iVar3;
        iVar3 = piVar1[1] + (int)((float)dVar6 * 1000.0);
        if (iVar3 < *(int *)((long)pTimesIn + 4)) {
          iVar3 = *(int *)((long)pTimesIn + 4);
        }
        *(int *)((long)pTimesIn + 4) = iVar3;
        if (MVar2 != MIO_PHASE_NONINV) goto LAB_00533d93;
      }
      pPin = Mio_PinReadNext(pPin);
      lVar4 = lVar4 + 1;
    } while (pPin != (Mio_Pin_t *)0x0);
  }
  iVar3 = Mio_GateReadPinNum((Mio_Gate_t *)p);
  if ((int)lVar4 != iVar3) {
    __assert_fail("i == Mio_GateReadPinNum(pGate)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmTim.c"
                  ,0x61,"void Sfm_TimGateArrival(Sfm_Tim_t *, Mio_Gate_t *, int **, int *)");
  }
  return;
}

Assistant:

static inline void Sfm_TimGateArrival( Sfm_Tim_t * p, Mio_Gate_t * pGate, int ** pTimesIn, int * pTimeOut )
{
    Mio_Pin_t * pPin;  int i = 0;
    pTimeOut[0] = pTimeOut[1] = 0;
    Mio_GateForEachPin( pGate, pPin )
        Sfm_TimEdgeArrival( p, pPin, pTimesIn[i++], pTimeOut );
    assert( i == Mio_GateReadPinNum(pGate) );
}